

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_float32_suite::fail_array8_float32_overflow(void)

{
  array<float,_1UL> value;
  value_type input [10];
  decoder decoder;
  undefined4 local_58;
  return_type local_54;
  size_type local_50;
  uchar local_48 [16];
  decoder local_38;
  
  local_38.input._M_str = local_48;
  local_48[0] = 0xad;
  local_48[1] = '\b';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = 0x80;
  local_48[5] = '?';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = 0x80;
  local_48[9] = '?';
  local_38.input._M_len = 10;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_54 = 0.0;
  local_50 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::float32>::decode(&local_38,&local_54,1);
  local_58 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd42,"void compact_float32_suite::fail_array8_float32_overflow()",&local_50,&local_58
            );
  return;
}

Assistant:

void fail_array8_float32_overflow()
{
    const value_type input[] = { token::code::array8_float32, 0x08, 0x00, 0x00, 0x80, 0x3F, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    std::array<token::float32::type, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}